

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O0

string * __thiscall
Tools::CutPathString(string *__return_storage_ptr__,Tools *this,string *longPath)

{
  char cVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  size_type sVar5;
  reference pvVar6;
  int local_78;
  int i;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string currentWord;
  string shortPath;
  string *longPath_local;
  Tools *this_local;
  
  std::__cxx11::string::string((string *)(currentWord.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"",&local_61);
  std::allocator<char>::~allocator(&local_61);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this->words);
  std::__cxx11::string::operator+=((string *)longPath,"/");
  local_78 = 0;
  do {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= (ulong)(long)local_78) {
      this_00 = this->words;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(this_00);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(this_00,sVar5 - 1);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar6);
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)(currentWord.field_2._M_local_buf + 8));
      return __return_storage_ptr__;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)longPath);
    if (*pcVar3 == '/') {
LAB_00109751:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this->words,(value_type *)local_60);
      std::__cxx11::string::operator=((string *)local_60,"");
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)longPath);
      cVar1 = *pcVar3;
      lVar4 = std::__cxx11::string::length();
      if ((long)cVar1 == lVar4 + -1) goto LAB_00109751;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)longPath);
      std::__cxx11::string::operator+=((string *)local_60,*pcVar3);
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

string CutPathString(string longPath) {
        string shortPath;
        string currentWord = "";

        this->words->clear();
        longPath += "/";
        for (int i = 0; i < longPath.length(); i++) {
            if (longPath[i] == '/' || longPath[i] == longPath.length() - 1) {
                this->words->push_back(currentWord);
                currentWord = "";
            } else {
                currentWord += longPath[i];
            }
        }

        return this->words->at(this->words->size() - 1);
    }